

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_format_proto3.pb.cc
# Opt level: O1

void proto3::TestMessage::SharedDtor(MessageLite *self)

{
  MessageType *pMVar1;
  ulong uVar2;
  
  if (((self->_internal_metadata_).ptr_ & 1) != 0) {
    google::protobuf::internal::InternalMetadata::
    DeleteOutOfLineHelper<google::protobuf::UnknownFieldSet>(&self->_internal_metadata_);
  }
  uVar2 = (self->_internal_metadata_).ptr_;
  if ((uVar2 & 1) != 0) {
    uVar2 = *(ulong *)(uVar2 & 0xfffffffffffffffe);
  }
  if (uVar2 == 0) {
    google::protobuf::internal::ArenaStringPtr::Destroy
              ((ArenaStringPtr *)&self[0x10]._internal_metadata_);
    google::protobuf::internal::ArenaStringPtr::Destroy((ArenaStringPtr *)(self + 0x11));
    google::protobuf::internal::ArenaStringPtr::Destroy
              ((ArenaStringPtr *)&self[0x11]._internal_metadata_);
    google::protobuf::internal::ArenaStringPtr::Destroy((ArenaStringPtr *)(self + 0x12));
    pMVar1 = (MessageType *)self[0x12]._internal_metadata_.ptr_;
    if (pMVar1 != (MessageType *)0x0) {
      MessageType::~MessageType(pMVar1);
      operator_delete(pMVar1,0x20);
    }
    pMVar1 = (MessageType *)self[0x13]._vptr_MessageLite;
    if (pMVar1 != (MessageType *)0x0) {
      MessageType::~MessageType(pMVar1);
      operator_delete(pMVar1,0x20);
    }
    google::protobuf::RepeatedPtrField<proto3::MessageType>::~RepeatedPtrField
              ((RepeatedPtrField<proto3::MessageType> *)(self + 0xf));
    google::protobuf::RepeatedField<int>::~RepeatedField
              ((RepeatedField<int> *)&self[0xd]._internal_metadata_);
    google::protobuf::
    RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~RepeatedPtrField((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)(self + 0xc));
    google::protobuf::
    RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~RepeatedPtrField((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&self[10]._internal_metadata_);
    google::protobuf::RepeatedField<double>::~RepeatedField
              ((RepeatedField<double> *)&self[9]._internal_metadata_);
    google::protobuf::RepeatedField<float>::~RepeatedField
              ((RepeatedField<float> *)&self[8]._internal_metadata_);
    google::protobuf::RepeatedField<unsigned_long>::~RepeatedField
              ((RepeatedField<unsigned_long> *)(self + 7));
    google::protobuf::RepeatedField<unsigned_int>::~RepeatedField
              ((RepeatedField<unsigned_int> *)&self[5]._internal_metadata_);
    google::protobuf::RepeatedField<long>::~RepeatedField((RepeatedField<long> *)(self + 4));
    google::protobuf::RepeatedField<int>::~RepeatedField
              ((RepeatedField<int> *)&self[2]._internal_metadata_);
    google::protobuf::RepeatedField<bool>::~RepeatedField
              ((RepeatedField<bool> *)&self[1]._internal_metadata_);
    return;
  }
  SharedDtor((TestMessage *)&stack0xffffffffffffffe0);
}

Assistant:

inline void TestMessage::SharedDtor(MessageLite& self) {
  TestMessage& this_ = static_cast<TestMessage&>(self);
  this_._internal_metadata_.Delete<::google::protobuf::UnknownFieldSet>();
  ABSL_DCHECK(this_.GetArena() == nullptr);
  this_._impl_.string_value_.Destroy();
  this_._impl_.bytes_value_.Destroy();
  this_._impl_.optional_string_value_.Destroy();
  this_._impl_.optional_bytes_value_.Destroy();
  delete this_._impl_.message_value_;
  delete this_._impl_.optional_message_value_;
  this_._impl_.~Impl_();
}